

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# msd_lsd.cpp
# Opt level: O3

void fill_cache<8u>(Cacheblock<8U> *cache,size_t N,size_t depth)

{
  ulong uVar1;
  size_t sVar2;
  Cacheblock<8U> *pCVar3;
  
  if (N != 0) {
    sVar2 = 0;
    pCVar3 = cache;
    do {
      uVar1 = 0;
      do {
        if (cache[sVar2].ptr[uVar1 + depth] == '\0') {
          if (uVar1 < 8) {
            memset((pCVar3->chars)._M_elems + uVar1,0,8 - uVar1);
          }
          break;
        }
        (pCVar3->chars)._M_elems[uVar1] = cache[sVar2].ptr[uVar1 + depth];
        uVar1 = uVar1 + 1;
      } while (uVar1 != 8);
      sVar2 = sVar2 + 1;
      pCVar3 = pCVar3 + 1;
    } while (sVar2 != N);
  }
  return;
}

Assistant:

static void
fill_cache(Cacheblock<CachedChars>* cache, size_t N, size_t depth)
{
	for (size_t i=0; i < N; ++i) {
		unsigned int j=0;
		while (j < CachedChars && cache[i].ptr[depth+j]) {
			cache[i].chars[j] = cache[i].ptr[depth+j];
			++j;
		}
		while (j < CachedChars) {
			cache[i].chars[j] = 0;
			++j;
		}
	}
}